

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::passLinearObjectives
          (Highs *this,HighsInt num_linear_objective,HighsLinearObjective *linear_objective)

{
  ulong uVar1;
  HighsStatus HVar2;
  ulong uVar3;
  
  if (num_linear_objective < 0) {
    return kOk;
  }
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::clear
            (&this->multi_linear_objective_);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if ((uint)num_linear_objective == uVar3) break;
    HVar2 = addLinearObjective(this,linear_objective,(HighsInt)uVar3);
    linear_objective = linear_objective + 1;
    uVar1 = uVar3 + 1;
  } while (HVar2 == kOk);
  return -(uint)(uVar3 < (uint)num_linear_objective);
}

Assistant:

HighsStatus Highs::passLinearObjectives(
    const HighsInt num_linear_objective,
    const HighsLinearObjective* linear_objective) {
  if (num_linear_objective < 0) return HighsStatus::kOk;
  this->multi_linear_objective_.clear();
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    if (this->addLinearObjective(linear_objective[iObj], iObj) !=
        HighsStatus::kOk)
      return HighsStatus::kError;
  return HighsStatus::kOk;
}